

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

void ecx_SDOerror(ecx_contextt *context,uint16 Slave,uint16 Index,uint8 SubIdx,int32 AbortCode)

{
  undefined1 local_38 [8];
  ec_errort Ec;
  int32 AbortCode_local;
  uint8 SubIdx_local;
  uint16 Index_local;
  uint16 Slave_local;
  ecx_contextt *context_local;
  
  Ec.field_6.AbortCode = AbortCode;
  Ec.field_6.field_1.w2._1_1_ = SubIdx;
  local_38 = (undefined1  [8])osal_current_time();
  Ec.Time.usec._2_1_ = Ec.field_6.field_1.w2._1_1_;
  *context->ecaterror = '\x01';
  Ec.Signal = '\0';
  Ec._9_1_ = 0;
  Ec.Slave = 0;
  Ec.Index = Ec.field_6._0_2_;
  Ec.SubIdx = Ec.field_6._2_1_;
  Ec._15_1_ = Ec.field_6._3_1_;
  Ec.Time.sec._2_2_ = Slave;
  Ec.Time.usec._0_2_ = Index;
  ecx_pusherror(context,(ec_errort *)local_38);
  return;
}

Assistant:

PACKED_END

/** Report SDO error.
 *
 * @param[in]  context        = context struct
 * @param[in]  Slave      = Slave number
 * @param[in]  Index      = Index that generated error
 * @param[in]  SubIdx     = Subindex that generated error
 * @param[in]  AbortCode  = Abortcode, see EtherCAT documentation for list
 */
void ecx_SDOerror(ecx_contextt *context, uint16 Slave, uint16 Index, uint8 SubIdx, int32 AbortCode)
{
   ec_errort Ec;

   Ec.Time = osal_current_time();
   Ec.Slave = Slave;
   Ec.Index = Index;
   Ec.SubIdx = SubIdx;
   *(context->ecaterror) = TRUE;
   Ec.Etype = EC_ERR_TYPE_SDO_ERROR;
   Ec.AbortCode = AbortCode;
   ecx_pusherror(context, &Ec);
}